

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array_Data_Types.cc
# Opt level: O0

int __thiscall Array_Data_Symbol::array_allocation(Array_Data_Symbol *this,uint32_t symbol_len)

{
  size_type sVar1;
  reference this_00;
  int local_18;
  int i;
  uint32_t symbol_len_local;
  Array_Data_Symbol *this_local;
  
  this->_sym_len = symbol_len;
  this->sym_len = this->_sym_len;
  std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::resize
            (&this->symbol,(ulong)this->_L);
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::size(&this->symbol);
    if (sVar1 <= (ulong)(long)local_18) break;
    this_00 = std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator[]
                        (&this->symbol,(long)local_18);
    Vector_Data_DEF::allocate_size(this_00,this->_sym_len);
    local_18 = local_18 + 1;
  }
  return 0;
}

Assistant:

int Array_Data_Symbol::array_allocation(uint32_t symbol_len)
{
	//std::vector< std::vector<uint8_t> > tmp;
	_sym_len = symbol_len;
	sym_len = _sym_len;

	//symbol.resize(_L);

	symbol.resize(_L);

	//symbol[0].allocate_size(symbol_len);
	for (int i = 0; i < symbol.size(); i++)
	{
		symbol[i].allocate_size(_sym_len);
	}

//	std::cout << "IS Numbers : " << symbol.size() << std::endl;

	//symbol_pointer = new class Vector_Data_DEF(symbol_len);


	return 0;
}